

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O1

shared_ptr<Image> runRippleStage(Image *previous,WaterEffectOptions *options)

{
  Image *this;
  long *plVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<Image> sVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  previous->pixels = (Pixel *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Image,std::allocator<Image>,unsigned_int_const&,unsigned_int_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&previous->raw,(Image **)previous,
             (allocator<Image> *)&local_60,(uint *)&options->blur,(uint *)&options->blur_size);
  applyRipple((Image *)options,(Image *)previous->pixels,
              *(float *)((long)&in_RDX[1]._M_string_length + 4));
  _Var3._M_pi = extraout_RDX;
  if (in_RDX[1].field_2._M_local_buf[0] == '\x01') {
    this = (Image *)previous->pixels;
    std::operator+(&local_40,"output/",in_RDX);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_60.field_2._M_allocated_capacity = *psVar2;
      local_60.field_2._8_8_ = plVar1[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar2;
      local_60._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_60._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    Image::toPNG(this,&local_60);
    _Var3._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
      _Var3._M_pi = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      _Var3._M_pi = extraout_RDX_02;
    }
  }
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = previous;
  return (shared_ptr<Image>)sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runRippleStage(const Image *previous, const WaterEffectOptions *options) {
  // Create a new image to store the result
  auto img_rippled = std::make_shared<Image>(previous->width, previous->height);

  // Apply the ripple effect
  applyRipple(previous, img_rippled.get(), options->ripple_frequency);

  // Save the resulting image
  if (options->save_intermediate)
    img_rippled->toPNG("output/" + options->img_name + "_rippled.png");

  return img_rippled;
}